

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LFSR.hpp
# Opt level: O2

void __thiscall Numeric::LFSR<unsigned_int,_73728U>::LFSR(LFSR<unsigned_int,_73728U> *this)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  size_t c;
  long lVar4;
  
  this->value_ = 0;
  uVar2 = 0;
  while (uVar2 == 0) {
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      iVar3 = rand();
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)iVar3 * 0x7f;
      *(char *)((long)&this->value_ + lVar4) = SUB161(auVar1 / ZEXT816(0x7fffffff),0);
    }
    uVar2 = this->value_;
  }
  return;
}

Assistant:

constexpr LFSR() noexcept {
			// Randomise the value, ensuring it doesn't end up being 0;
			// don't set any top bits, in case this is a signed type.
			while(!value_) {
				uint8_t *value_byte = reinterpret_cast<uint8_t *>(&value_);
				for(size_t c = 0; c < sizeof(IntType); ++c) {
					*value_byte = uint8_t(uint64_t(rand()) * 127 / RAND_MAX);
					++value_byte;
				}
			}
		}